

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O2

int libssh2_agent_get_identity
              (LIBSSH2_AGENT *agent,libssh2_agent_publickey **ext,libssh2_agent_publickey *oprev)

{
  void *pvVar1;
  
  if ((oprev == (libssh2_agent_publickey *)0x0) || ((list_node *)oprev->node == (list_node *)0x0)) {
    pvVar1 = _libssh2_list_first(&agent->head);
  }
  else {
    pvVar1 = _libssh2_list_next((list_node *)oprev->node);
  }
  if (pvVar1 != (void *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x18) = 0x3bdefed2;
    *(void **)((long)pvVar1 + 0x20) = pvVar1;
    *ext = (libssh2_agent_publickey *)((long)pvVar1 + 0x18);
  }
  return (uint)(pvVar1 == (void *)0x0);
}

Assistant:

LIBSSH2_API int
libssh2_agent_get_identity(LIBSSH2_AGENT *agent,
                           struct libssh2_agent_publickey **ext,
                           struct libssh2_agent_publickey *oprev)
{
    struct agent_publickey *node;
    if(oprev && oprev->node) {
        /* we have a starting point */
        struct agent_publickey *prev = oprev->node;

        /* get the next node in the list */
        node = _libssh2_list_next(&prev->node);
    }
    else
        node = _libssh2_list_first(&agent->head);

    if(!node)
        /* no (more) node */
        return 1;

    *ext = agent_publickey_to_external(node);

    return 0;
}